

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall mp::SPAdapter::UpdateConStages(SPAdapter *this,int var_index,int stage)

{
  int iVar1;
  int iVar2;
  reference __b;
  int *piVar3;
  ColProblem *this_00;
  long in_RDI;
  int *con_stage;
  int end;
  int k;
  int in_stack_ffffffffffffffcc;
  ColProblem *in_stack_ffffffffffffffd0;
  int local_14;
  int local_10 [4];
  
  local_14 = ColProblem::col_start(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  iVar1 = ColProblem::col_start(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  for (; local_14 != iVar1; local_14 = local_14 + 1) {
    this_00 = (ColProblem *)(in_RDI + 0x1a0);
    iVar2 = ColProblem::row_index(this_00,in_stack_ffffffffffffffcc);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)this_00,(long)iVar2);
    piVar3 = std::max<int>(local_10,__b);
    *__b = *piVar3;
  }
  return;
}

Assistant:

void SPAdapter::UpdateConStages(int var_index, int stage) {
  for (int k = problem_.col_start(var_index),
       end = problem_.col_start(var_index + 1); k != end; ++k) {
    int &con_stage = con_orig2core_[problem_.row_index(k)];
    con_stage = std::max(stage, con_stage);
  }
}